

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

fio_protocol_s * fio_protocol_try_lock(intptr_t uuid,fio_protocol_lock_e type)

{
  char *pcVar1;
  char cVar2;
  fio_protocol_s *pfVar3;
  fio_data_s *pfVar4;
  uint uVar5;
  int *piVar6;
  undefined1 *puVar7;
  long lVar8;
  fio_lock_i ret;
  fio_lock_i ret_1;
  fio_lock_i ret_2;
  fio_lock_i ret_3;
  fio_lock_i ret_4;
  
  pfVar4 = fio_data;
  if (((uuid < 0) || (uVar5 = (uint)((ulong)uuid >> 8), fio_data->capa <= uVar5)) ||
     (lVar8 = (long)(int)uVar5 * 0xa8, *(char *)((long)fio_data + lVar8 + 0x6d) != (char)uuid)) {
    piVar6 = __errno_location();
    *piVar6 = 9;
  }
  else {
    piVar6 = __errno_location();
    *piVar6 = 0;
    LOCK();
    pcVar1 = (char *)((long)pfVar4 + lVar8 + 0x6c);
    cVar2 = *pcVar1;
    *pcVar1 = '\x01';
    UNLOCK();
    if (cVar2 == '\0') {
      pfVar3 = *(fio_protocol_s **)((long)fio_data + lVar8 + 0x58);
      if (pfVar3 == (fio_protocol_s *)0x0) {
        LOCK();
        *(undefined1 *)((long)fio_data + lVar8 + 0x6c) = 0;
        UNLOCK();
        *piVar6 = 9;
        return (fio_protocol_s *)0x0;
      }
      LOCK();
      pcVar1 = (char *)((long)&pfVar3->rsv + (ulong)type);
      cVar2 = *pcVar1;
      *pcVar1 = '\x01';
      UNLOCK();
      puVar7 = (undefined1 *)((long)fio_data + lVar8 + 0x6c);
      if (cVar2 == '\0') {
        LOCK();
        *puVar7 = 0;
        UNLOCK();
        return pfVar3;
      }
      LOCK();
      *puVar7 = 0;
      UNLOCK();
    }
    *piVar6 = 0xb;
  }
  return (fio_protocol_s *)0x0;
}

Assistant:

fio_protocol_s *fio_protocol_try_lock(intptr_t uuid,
                                      enum fio_protocol_lock_e type) {
  if (!uuid_is_valid(uuid)) {
    errno = EBADF;
    return NULL;
  }
  return protocol_try_lock(fio_uuid2fd(uuid), type);
}